

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O2

bool __thiscall grammar::has_any_empty_production(grammar *this)

{
  bool bVar1;
  pointer psVar2;
  _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_30;
  
  nonterminals((vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                *)&local_30,this);
  do {
    psVar2 = local_30._M_impl.super__Vector_impl_data._M_start;
    if (psVar2 == local_30._M_impl.super__Vector_impl_data._M_finish) break;
    bVar1 = has_empty_production(this,(token_t)psVar2->internal_rep);
    local_30._M_impl.super__Vector_impl_data._M_start = psVar2 + 1;
  } while (!bVar1);
  std::
  _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  ::~_Vector_base(&local_30);
  return psVar2 != local_30._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

[[nodiscard]] bool has_any_empty_production() const {
        for (const auto nonterm : this->nonterminals())
            if (this->has_empty_production(nonterm)) return true;

        return false;
    }